

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O0

WidthVector * __thiscall
KDReports::TableBreakingLogic::widthPerPage
          (WidthVector *__return_storage_ptr__,TableBreakingLogic *this,QVector<int> *colPerPage)

{
  int iVar1;
  qsizetype qVar2;
  const_reference piVar3;
  const_reference pdVar4;
  reference pdVar5;
  int local_4c;
  double dStack_48;
  int i;
  qreal pageTotalWidth;
  int local_38;
  int numColumnsForPage;
  int page;
  int local_24;
  int startColumn;
  QVector<int> *colPerPage_local;
  TableBreakingLogic *this_local;
  WidthVector *widths;
  
  qVar2 = QList<int>::size(colPerPage);
  if (this->m_pages < qVar2) {
    qt_assert("colPerPage.size() <= m_pages",
              "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsTableBreakingLogic.cpp"
              ,0x55);
  }
  local_24 = 0;
  QList<double>::QList(__return_storage_ptr__);
  qVar2 = QList<int>::size(colPerPage);
  QList<double>::resize(__return_storage_ptr__,qVar2);
  for (local_38 = 0; qVar2 = QList<int>::size(colPerPage), local_38 < qVar2; local_38 = local_38 + 1
      ) {
    piVar3 = QList<int>::operator[](colPerPage,(long)local_38);
    iVar1 = *piVar3;
    dStack_48 = 0.0;
    for (local_4c = local_24; local_4c < local_24 + iVar1; local_4c = local_4c + 1) {
      pdVar4 = QList<double>::operator[](&this->m_widths,(long)local_4c);
      dStack_48 = *pdVar4 + dStack_48;
    }
    local_24 = local_24 + iVar1;
    pdVar5 = QList<double>::operator[](__return_storage_ptr__,(long)local_38);
    *pdVar5 = dStack_48;
  }
  return __return_storage_ptr__;
}

Assistant:

TableBreakingLogic::WidthVector TableBreakingLogic::widthPerPage(const QVector<int> &colPerPage) const
{
    Q_ASSERT(colPerPage.size() <= m_pages);
    int startColumn = 0;
    WidthVector widths;
    widths.resize(colPerPage.size());
    for (int page = 0; page < colPerPage.size(); ++page) {
        const int numColumnsForPage = colPerPage[page];
        qreal pageTotalWidth = 0;
        for (int i = startColumn; i < startColumn + numColumnsForPage; ++i) {
            pageTotalWidth += m_widths[i];
        }
        startColumn += numColumnsForPage;
        widths[page] = pageTotalWidth;
    }
    return widths;
}